

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_schedule(Executor *this,Worker *worker,Node *node)

{
  pointer pBVar1;
  int iVar2;
  ulong uVar3;
  pthread_mutex_t *__mutex;
  Node *local_38;
  anon_class_16_2_3fe397bd local_30;
  
  local_30.node = &local_38;
  local_38 = node;
  if (worker->_executor == this) {
    uVar3 = (worker->_wsq)._bottom.super___atomic_base<long>._M_i;
    local_30.this = this;
    if ((long)(uVar3 - (worker->_wsq)._top.super___atomic_base<long>._M_i) < 0x100) {
      (worker->_wsq)._buffer[uVar3 & 0xff]._M_b._M_p = node;
      (worker->_wsq)._bottom.super___atomic_base<long>._M_i = uVar3 + 1;
      local_30.node = &local_38;
    }
    else {
      _schedule::anon_class_16_2_3fe397bd::operator()(&local_30);
    }
    NonblockingNotifierV2::_notify<false>(&this->_notifier);
    return;
  }
  pBVar1 = (this->_buffers)._buckets.
           super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)node %
          (ulong)(((long)(this->_buffers)._buckets.
                         super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 7) *
                 -0x5555555555555555);
  __mutex = (pthread_mutex_t *)(pBVar1 + uVar3);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    UnboundedTaskQueue<tf::Node_*>::push
              (&(this->_buffers)._buckets.
                super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].queue,node);
    pthread_mutex_unlock(__mutex);
    NonblockingNotifierV2::_notify<false>(&this->_notifier);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

inline void Executor::_schedule(Worker& worker, Node* node) {
  
  // caller is a worker to this pool - starting at v3.5 we do not use
  // any complicated notification mechanism as the experimental result
  // has shown no significant advantage.
  if(worker._executor == this) {
    worker._wsq.push(node, [&](){ _buffers.push(node); });
    _notifier.notify_one();
    return;
  }
  
  // go through the centralized queue
  _buffers.push(node);
  _notifier.notify_one();
}